

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int mkdir_p(char *path)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  char mypath [4096];
  
  pcVar5 = mypath;
  sVar2 = strlen(path);
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (sVar2 < 0x1000) {
    strcpy(mypath,path);
    iVar4 = -1;
    do {
      while( true ) {
        pcVar5 = pcVar5 + 1;
        if (*pcVar5 != '/') break;
        *pcVar5 = '\0';
        iVar1 = mkdir(mypath,0x1c0);
        if ((iVar1 != 0) && (*piVar3 != 0x11)) {
          return -1;
        }
        *pcVar5 = '/';
      }
    } while (*pcVar5 != '\0');
    iVar1 = mkdir(mypath,0x1c0);
    if ((iVar1 == 0) || (*piVar3 == 0x11)) {
      iVar4 = 0;
    }
  }
  else {
    fwrite("Output directory path too long\n",0x1f,1,_stderr);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int mkdir_p(const char *path)
{
    const size_t len = strlen(path);
    char mypath[PATH_MAX];
    char *p;

    errno = 0;

    /* copy string so its mutable */
    if (len > sizeof(mypath)-1) {
        fprintf(stderr, "Output directory path too long\n");
        return -1;
    }

    strcpy(mypath, path);

    /* iterate the string */
    for (p = mypath + 1; *p; p++) {
        if (*p == '/') {
            /* temporarily truncate */
            *p = '\0';

            if (mkdir(mypath, S_IRWXU) != 0) {
                if (errno != EEXIST)
                    return -1;
            }
            *p = '/';
        }
    }

    if (mkdir(mypath, S_IRWXU) != 0) {
        if (errno != EEXIST)
            return -1;
    }

    return 0;
}